

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

Employee * __thiscall Employee::operator=(Employee *this,Employee *e)

{
  Employee *e_local;
  Employee *this_local;
  
  Person::operator=(&this->super_Person,&e->super_Person);
  this->hourWork = e->hourWork;
  this->salaryPerHour = e->salaryPerHour;
  this->workToDo = e->workToDo;
  this->workDone = e->workDone;
  return this;
}

Assistant:

Employee& Employee::operator=(const Employee &e) {
    Person::operator=(e);
    hourWork = e.hourWork;
    salaryPerHour = e.salaryPerHour;
    workToDo = e.workToDo;
    workDone = e.workDone;
    return *this;
}